

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O0

skynet_context * skynet_handle_grab(uint32_t handle)

{
  skynet_context *ctx_00;
  handle_storage *lock;
  uint32_t uVar1;
  skynet_context *ctx;
  skynet_context *psStack_20;
  uint32_t hash;
  skynet_context *result;
  handle_storage *s;
  uint32_t handle_local;
  
  lock = H;
  psStack_20 = (skynet_context *)0x0;
  rwlock_rlock(&H->lock);
  ctx_00 = lock->slot[handle & lock->slot_size - 1U];
  if (ctx_00 != (skynet_context *)0x0) {
    uVar1 = skynet_context_handle(ctx_00);
    if (uVar1 == handle) {
      skynet_context_grab(ctx_00);
      psStack_20 = ctx_00;
    }
  }
  rwlock_runlock(&lock->lock);
  return psStack_20;
}

Assistant:

struct skynet_context * 
skynet_handle_grab(uint32_t handle) {
	struct handle_storage *s = H;
	struct skynet_context * result = NULL;

	rwlock_rlock(&s->lock);

	uint32_t hash = handle & (s->slot_size-1);
	struct skynet_context * ctx = s->slot[hash];
	if (ctx && skynet_context_handle(ctx) == handle) {
		result = ctx;
		skynet_context_grab(result);
	}

	rwlock_runlock(&s->lock);

	return result;
}